

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_perform_auth(connectdata *conn,char *mech,char *initresp)

{
  smtp_conn *smtpc;
  CURLcode result;
  char *initresp_local;
  char *mech_local;
  connectdata *conn_local;
  
  if (initresp == (char *)0x0) {
    smtpc._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"AUTH %s",mech);
  }
  else {
    smtpc._4_4_ = Curl_pp_sendf(&(conn->proto).ftpc.pp,"AUTH %s %s",mech,initresp);
  }
  return smtpc._4_4_;
}

Assistant:

static CURLcode smtp_perform_auth(struct connectdata *conn,
                                  const char *mech,
                                  const char *initresp)
{
  CURLcode result = CURLE_OK;
  struct smtp_conn *smtpc = &conn->proto.smtpc;

  if(initresp) {                                  /* AUTH <mech> ...<crlf> */
    /* Send the AUTH command with the initial response */
    result = Curl_pp_sendf(&smtpc->pp, "AUTH %s %s", mech, initresp);
  }
  else {
    /* Send the AUTH command */
    result = Curl_pp_sendf(&smtpc->pp, "AUTH %s", mech);
  }

  return result;
}